

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SPFForceManager.cpp
# Opt level: O2

void __thiscall OpenMD::RNEMD::SPFForceManager::updateSelfPotentials(SPFForceManager *this)

{
  Snapshot *this_00;
  potVec selfPotentials;
  Vector<double,_7U> local_100;
  potVec local_c8;
  potVec local_90;
  Vector<double,_7U> local_58;
  
  Snapshot::getSelfPotentials(&local_90,this->temporarySourceSnapshot_);
  Snapshot::getSelfPotentials(&local_c8,this->temporarySinkSnapshot_);
  linearCombination<OpenMD::Vector<double,7u>>(&local_58,this,&local_90,&local_c8);
  this_00 = this->currentSnapshot_;
  Vector<double,_7U>::Vector(&local_100,&local_58);
  Snapshot::setSelfPotentials(this_00,&local_100);
  return;
}

Assistant:

void SPFForceManager::updateSelfPotentials() {
    potVec selfPotentials =
        linearCombination(temporarySourceSnapshot_->getSelfPotentials(),
                          temporarySinkSnapshot_->getSelfPotentials());
    currentSnapshot_->setSelfPotentials(selfPotentials);
  }